

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapcoder.c
# Opt level: O3

MapcodeError decoderEngine(DecodeRec *dec,int parseFlags)

{
  char *__s;
  byte bVar1;
  char cVar2;
  undefined1 uVar3;
  Territory TVar4;
  uint uVar5;
  bool bVar6;
  MapcodeError MVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  size_t sVar12;
  char *pcVar13;
  uint uVar14;
  int iVar15;
  Territory TVar16;
  int iVar17;
  int iVar18;
  MapcodeZone *pMVar19;
  byte *pbVar20;
  byte bVar21;
  uint uVar22;
  long lVar23;
  uint uVar24;
  int iVar25;
  int GOODROUNDER;
  undefined8 in_R10;
  int iVar26;
  ulong uVar27;
  ulong uVar28;
  uint uVar29;
  Point32 PVar30;
  long lVar31;
  TerritoryBoundary *pTVar32;
  uint *puVar33;
  double dVar34;
  double dVar35;
  undefined1 auVar36 [16];
  Point PVar37;
  double dVar38;
  char input [8];
  MapcodeZone z;
  double local_d8;
  double dStack_d0;
  undefined4 local_b0;
  double local_a8;
  double dStack_a0;
  MapcodeZone *local_90;
  char *local_88;
  undefined4 local_7c;
  MapcodeZone local_78;
  double local_58;
  double dStack_50;
  double local_48;
  
  MVar7 = parseMapcodeString(&dec->mapcodeElements,dec->orginput,parseFlags,dec->context);
  if (MVar7 != ERR_OK) {
    (dec->mapcodeElements).territoryISO[0] = '\0';
    (dec->mapcodeElements).properMapcode[0] = '\0';
    (dec->mapcodeElements).precisionExtension[0] = '\0';
    return MVar7;
  }
  TVar4 = (dec->mapcodeElements).territoryCode;
  iVar11 = (dec->mapcodeElements).indexOfDot;
  dec->context = TVar4;
  __s = (dec->mapcodeElements).properMapcode;
  dec->mapcode = __s;
  dec->extension = (dec->mapcodeElements).precisionExtension;
  sVar12 = strlen(__s);
  pcVar13 = strchr(__s,0x41);
  if (((pcVar13 == (char *)0x0) && (pcVar13 = strchr(__s,0x45), pcVar13 == (char *)0x0)) &&
     (pcVar13 = strchr(__s,0x55), pcVar13 == (char *)0x0)) {
    local_7c = (undefined4)CONCAT71((int7)((ulong)in_R10 >> 8),1);
  }
  else {
    iVar8 = unpackIfAllDigits(__s);
    if (iVar8 < 1) {
      return ERR_INVALID_VOWEL;
    }
    local_7c = 0;
  }
  iVar11 = iVar11 * 9;
  iVar8 = iVar11 + (int)sVar12;
  if (0x37 < iVar8) {
    return ERR_MAPCODE_UNDECODABLE;
  }
  uVar14 = (iVar11 + (int)sVar12) - 1;
  TVar16 = TERRITORY_AAA;
  if (uVar14 != 0x36) {
    if (TVar4 < _TERRITORY_MIN) {
      return ERR_MISSING_TERRITORY;
    }
    TVar16 = TVar4;
    if (0xfffffdea < (uint)(TVar4 + ~TERRITORY_AAA)) {
      uVar28 = (ulong)(uint)(TVar4 + ~_TERRITORY_MIN);
      if ((long)""[uVar28] != 0) {
        if (iVar8 == 0x23) {
LAB_0016bab0:
          if (0x23 < uVar28 - 0x10f && 0x1f < uVar28 - 0xe9) goto LAB_0016bae8;
        }
        else if (iVar8 != 0x2d) {
          if (iVar8 != 0x2c) goto LAB_0016bae8;
          goto LAB_0016bab0;
        }
        TVar16 = PARENT_NR[""[uVar28]];
      }
    }
  }
LAB_0016bae8:
  uVar22 = *(uint *)("" + (long)TVar16 * 4 + 0x28c);
  local_d8 = (double)(ulong)uVar22;
  iVar11 = *(int *)("" + (long)TVar16 * 4 + 0x290);
  if ((int)uVar22 < iVar11) {
    local_a8 = (double)(long)(int)uVar22;
    lVar23 = (long)iVar11 + -1;
    local_88 = (char *)((long)local_a8 * 0x14);
    puVar33 = (uint *)(local_88 + 0x1c3480);
    uVar28 = 0;
    while( true ) {
      uVar5 = *puVar33;
      bVar21 = ((byte)uVar5 & 0x1f) + (char)((uVar5 & 0x1f) * 0x34 >> 8) * -5 +
               (char)((uVar5 & 0x1f) / 5) * '\n' + 1;
      uVar29 = (uint)bVar21;
      uVar24 = uVar5 >> 7 & 3;
      iVar9 = (int)uVar28;
      if (uVar24 == 1) {
        if ((iVar8 != uVar29 + 0xb) ||
           ("0123456789BCDFGHJKLMNPQRSTVWXYZAEU"[uVar5 >> 0xb & 0x1f] != *__s)) goto LAB_0016bc68;
        MVar7 = decodeGrid(dec,uVar22 + iVar9,1);
        goto LAB_0016c549;
      }
      if (uVar24 != 0) break;
      if ((uVar5 & 0x40) == 0) {
        if ((uVar14 != uVar29) && (uVar14 != 0x16 || bVar21 != 0x15)) goto LAB_0016bc68;
        MVar7 = decodeGrid(dec,uVar22 + iVar9,0);
        pMVar19 = &dec->zone;
        restrictZoneTo(pMVar19,pMVar19,TERRITORY_BOUNDARIES + lVar23);
        if (MVar7 != ERR_OK) goto LAB_0016c6db;
        local_90 = pMVar19;
        if ((uVar5 >> 9 & 1) == 0) goto LAB_0016c559;
        local_58 = ((dec->zone).fminy + (dec->zone).fmaxy) * 0.5;
        dStack_50 = ((dec->zone).fmaxx + (dec->zone).fminx) * 0.5;
        local_48 = floor(local_58);
        local_58 = floor(dStack_50);
        (dec->result).lat = local_48;
        (dec->result).lon = local_58;
        dVar35 = floor(local_48 / 810000.0);
        PVar30.latMicroDeg = (int)dVar35;
        dVar35 = floor(local_58 / 3240000.0);
        PVar30.lonMicroDeg = (int)dVar35;
        dec->coord32 = PVar30;
        if ((int)(uVar22 + iVar9) <= (int)uVar22) goto LAB_0016c6d5;
        pTVar32 = (TerritoryBoundary *)(puVar33 + -9);
        lVar31 = (long)local_a8 + uVar28;
        goto LAB_0016c1c2;
      }
      if (((uVar29 == 0x15 && uVar14 == 0x16) || (uVar29 == 0x16 && uVar14 == 0x20)) ||
         (uVar29 == 0xd && uVar14 == 0x17)) {
        pcVar13 = dec->mapcode;
        dVar35 = (double)strlen(pcVar13);
        MVar7 = ERR_BAD_MAPCODE_LENGTH;
        if (SUB84(dVar35,0) - 7U < 0xfffffffe) goto LAB_0016c549;
        local_a8 = dVar35;
        strcpy((char *)&local_b0,pcVar13);
        strcpy((char *)((long)&local_b0 + (ulong)(uVar29 == 0x16) + 2),
               pcVar13 + (ulong)(uVar29 == 0x16) + 3);
        iVar11 = *(int *)("" + (long)dec->context * 4 + 0x28c);
        iVar8 = countNamelessRecords(iVar9 + uVar22,iVar11);
        iVar9 = firstNamelessRecord(iVar9 + uVar22,iVar11);
        lVar31 = 0x1f / (long)iVar8;
        pMVar19 = &local_78;
        strcpy((char *)pMVar19,(char *)&local_b0);
        iVar18 = (int)lVar31;
        iVar11 = (int)(0x1f % (long)iVar8);
        if (0x1f < iVar8 || uVar29 == 0x15) {
          if ((uVar29 == 0x15) || (0x3d < iVar8)) {
            lVar31 = 0x1b4d89f;
            if (bVar21 == 0x15) {
              lVar31 = 0xe1781;
            }
            iVar17 = (int)(lVar31 / (long)iVar8);
            if (iVar8 == 0x3e) {
              iVar17 = iVar17 + 1;
            }
            else {
              iVar17 = (iVar17 / 0x3c1) * 0x3c1;
            }
            iVar15 = 0;
            while( true ) {
              bVar21 = *(byte *)&pMVar19->fminy;
              if ((bVar21 == 0) || (bVar21 == 0x2e)) break;
              pMVar19 = (MapcodeZone *)((long)&pMVar19->fminy + 1);
              iVar15 = (int)(char)(&decodeChar_decode_chars)[bVar21] + iVar15 * 0x1f;
            }
            iVar10 = iVar15 / iVar17;
            iVar15 = iVar15 % iVar17;
LAB_0016c34d:
            if (0x1f < iVar8 || uVar29 == 0x15) {
LAB_0016c3af:
              if ((uVar29 != 0x15) && (iVar8 < 0x3e)) {
                iVar15 = 0;
                pbVar20 = (byte *)((long)&local_78.fminy + 1);
                while( true ) {
                  bVar21 = *pbVar20;
                  if ((bVar21 == 0) || (bVar21 == 0x2e)) break;
                  iVar15 = (int)(char)(&decodeChar_decode_chars)[bVar21] + iVar15 * 0x1f;
                  pbVar20 = pbVar20 + 1;
                }
                if ((0x3e - iVar8 <= iVar10) && (0x745ef < iVar15)) {
                  iVar15 = iVar15 + -0x745f0;
                  iVar10 = iVar10 + 1;
                }
              }
            }
            else {
LAB_0016c352:
              iVar15 = 0;
              pMVar19 = &local_78;
              while( true ) {
                bVar21 = *(byte *)&pMVar19->fminy;
                if ((bVar21 == 0) || (bVar21 == 0x2e)) break;
                pMVar19 = (MapcodeZone *)((long)&pMVar19->fminy + 1);
                iVar15 = (int)(char)(&decodeChar_decode_chars)[bVar21] + iVar15 * 0x1f;
              }
              if (0 < iVar10) {
                if (iVar10 < iVar11) {
                  iVar11 = iVar10;
                }
                iVar15 = iVar15 + (iVar11 + iVar18 * iVar10) * -0xe1781;
              }
            }
            iVar10 = iVar10 + iVar9;
            iVar11 = TERRITORY_BOUNDARIES[iVar10].flags >> 0x10;
            if (((uint)TERRITORY_BOUNDARIES[iVar10].flags >> 10 & 1) == 0) {
              iVar8 = iVar15 / iVar11;
              iVar15 = iVar15 % iVar11;
            }
            else {
              iVar9 = TERRITORY_BOUNDARIES[iVar10].maxy - TERRITORY_BOUNDARIES[iVar10].miny;
              iVar8 = iVar9 >> 0x1f;
              iVar18 = -iVar8;
              iVar8 = iVar9 / 0x5a + iVar8;
              iVar17 = iVar8 + iVar18 + 1;
              iVar11 = (int)((long)(ulong)(uint)(iVar11 * iVar11) / (long)iVar17);
              iVar18 = iVar15 / (((iVar8 + iVar18) * 2 + 2) * 3);
              iVar8 = (iVar11 + -4) / 6;
              iVar9 = iVar8;
              if (iVar18 < iVar8) {
                iVar9 = iVar18;
              }
              iVar25 = 6;
              if (iVar8 <= iVar18) {
                iVar25 = iVar11 + iVar8 * -6;
              }
              iVar8 = iVar15 + iVar17 * iVar9 * -6;
              iVar15 = iVar8 / iVar25;
              iVar8 = iVar8 % iVar25 + iVar9 * 6;
            }
            MVar7 = ERR_MAPCODE_UNDECODABLE;
            if (iVar8 < iVar11) {
              uVar14 = TERRITORY_BOUNDARIES[iVar10].miny;
              iVar11 = TERRITORY_BOUNDARIES[iVar10].maxy;
              uVar22 = uVar14;
              if ((int)uVar14 < 0) {
                iVar9 = 0x168;
                if (iVar11 < 0) {
                  uVar22 = -iVar11;
                  goto LAB_0016c4eb;
                }
              }
              else {
LAB_0016c4eb:
                iVar9 = *(int *)(xDivider4_xdivider19 + (ulong)(uVar22 >> 0x13) * 4);
              }
              iVar8 = iVar8 * iVar9;
              iVar18 = iVar8 + 3;
              if (-1 < iVar8) {
                iVar18 = iVar8;
              }
              (dec->coord32).lonMicroDeg = (iVar18 >> 2) + TERRITORY_BOUNDARIES[iVar10].minx;
              (dec->coord32).latMicroDeg = iVar11 + iVar15 * -0x5a;
              MVar7 = decodeExtension(dec,iVar9,-0x5a,iVar8 % 4,uVar14,
                                      TERRITORY_BOUNDARIES[iVar10].maxx);
            }
            goto LAB_0016c549;
          }
          iVar10 = (int)(char)(&decodeChar_decode_chars)[local_78.fminy._0_1_];
          if (0x3e - iVar8 <= iVar10) {
            iVar10 = iVar8 + iVar10 * 2 + -0x3e;
            iVar15 = 0;
            goto LAB_0016c3af;
          }
          iVar15 = 0;
          if (uVar29 != 0x16) goto LAB_0016c3af;
        }
        else {
          cVar2 = (&decodeChar_decode_chars)[local_78.fminy._0_1_];
          iVar17 = iVar11 * (iVar18 + 1);
          uVar14 = cVar2 - iVar17;
          if (cVar2 < iVar17) {
            iVar10 = (int)(short)((short)cVar2 / (short)(iVar18 + 1));
            goto LAB_0016c352;
          }
          iVar10 = (short)((int)((uint)(ushort)((short)uVar14 >> 0xf) << 0x10 | uVar14 & 0xffff) /
                          (int)(short)lVar31) + iVar11;
          if ((uVar29 != 0x16) || (iVar18 != 1)) goto LAB_0016c352;
        }
        iVar15 = 0;
        if ((TERRITORY_BOUNDARIES[iVar10 + iVar9].flags & 0x400) == 0) {
          uVar28 = (ulong)(SUB84(local_a8,0) - 4);
          uVar3 = *(undefined1 *)((long)&local_78.fminy + uVar28);
          uVar27 = (ulong)(SUB84(local_a8,0) - 3);
          *(undefined1 *)((long)&local_78.fminy + uVar28) =
               *(undefined1 *)((long)&local_78.fminy + uVar27);
          *(undefined1 *)((long)&local_78.fminy + uVar27) = uVar3;
        }
        goto LAB_0016c34d;
      }
LAB_0016bc68:
      puVar33 = puVar33 + 5;
      uVar28 = uVar28 + 1;
      if ((uVar22 - iVar11) + (int)uVar28 == 0) goto LAB_0016bc7a;
    }
    if ((uVar14 != 0x17 || bVar21 != 0x16) && (uVar14 != 0x21 || bVar21 != 0x17)) goto LAB_0016bc68;
    pbVar20 = (byte *)dec->mapcode;
    local_88 = strchr((char *)pbVar20,0x2e);
    if (local_88 == (char *)0x0) {
      MVar7 = ERR_DOT_MISSING;
      goto LAB_0016c6db;
    }
    iVar11 = 0;
    while( true ) {
      bVar1 = *pbVar20;
      if ((bVar1 == 0) || (bVar1 == 0x2e)) break;
      pbVar20 = pbVar20 + 1;
      iVar11 = (int)(char)(&decodeChar_decode_chars)[bVar1] + iVar11 * 0x1f;
    }
    iVar11 = iVar11 * 0x745f;
    iVar8 = 0xe1781;
    if (0x16 < bVar21) {
      iVar8 = 0x1b4d89f;
    }
    iVar9 = 0;
    while ((uVar14 = *puVar33,
           (byte)(((byte)uVar14 & 0x1f) + (char)((uVar14 & 0x1f) * 0x34 >> 8) * -5 +
                  (char)((uVar14 & 0x1f) / 5) * '\n' + 1) == bVar21 && ((uVar14 >> 8 & 1) != 0))) {
      uVar22 = puVar33[-3];
      uVar5 = puVar33[-1];
      uVar24 = uVar22;
      if ((int)uVar22 < 0) {
        iVar18 = 0x168;
        if ((int)uVar5 < 0) {
          uVar24 = -uVar5;
          goto LAB_0016bd48;
        }
      }
      else {
LAB_0016bd48:
        iVar18 = *(int *)(xDivider4_xdivider19 + (ulong)(uVar24 >> 0x13) * 4);
      }
      iVar25 = uVar5 - uVar22;
      iVar17 = (int)((ulong)((long)(iVar25 + 0x59) * -0x49f49f49) >> 0x20) + iVar25 + 0x59;
      uVar24 = puVar33[-4];
      local_a8 = (double)CONCAT44(local_a8._4_4_,puVar33[-2]);
      iVar10 = puVar33[-2] - uVar24;
      iVar17 = (((iVar17 >> 6) - (iVar17 >> 0x1f)) + 0xaf) / 0xb0;
      iVar18 = ((iVar18 + iVar10 * 4 + -1) / iVar18 + 0xa7) / 0xa8;
      iVar15 = iVar17 * iVar18 * 0x745f;
      if ((uVar14 & 0x180) == 0x100) {
        iVar15 = iVar15 + iVar9 + iVar8 + -1;
        iVar15 = iVar15 - (iVar15 % iVar8 + iVar9);
      }
      iVar15 = iVar15 + iVar9;
      puVar33 = puVar33 + 5;
      iVar26 = iVar11 - iVar9;
      bVar6 = iVar9 <= iVar11;
      iVar9 = iVar15;
      if ((bVar6) && (iVar11 < iVar15)) {
        iVar18 = iVar18 * 0xa8;
        local_90 = (MapcodeZone *)CONCAT44(local_90._4_4_,(iVar10 + iVar18 + -1) / iVar18);
        iVar18 = (iVar25 + iVar17 * 0xb0 + -1) / (iVar17 * 0xb0);
        iVar26 = iVar26 / 0x745f;
        decodeTriple(local_88 + 1,(int *)&local_78,&local_b0);
        iVar11 = ((iVar26 % iVar17) * 0xb0 + local_b0) * iVar18;
        iVar9 = uVar5 - iVar11;
        (dec->coord32).latMicroDeg = iVar9;
        iVar8 = ((iVar26 / iVar17) * 0xa8 + local_78.fminy._0_4_) * (int)local_90;
        iVar17 = uVar24 + iVar8;
        (dec->coord32).lonMicroDeg = iVar17;
        if ((iVar8 < 0) || (((local_a8._0_4_ <= iVar17 || (iVar9 < (int)uVar22)) || (iVar11 < 0))))
        goto LAB_0016c6d5;
        MVar7 = decodeExtension(dec,(int)local_90 << 2,-iVar18,0,uVar22,local_a8._0_4_);
LAB_0016c549:
        if (MVar7 != ERR_OK) goto LAB_0016c6db;
        lVar23 = (long)(int)lVar23;
        goto LAB_0016c559;
      }
    }
LAB_0016bc7a:
    MVar7 = ERR_MAPCODE_UNDECODABLE;
    goto LAB_0016c6db;
  }
  goto LAB_0016c6d5;
  while( true ) {
    pMVar19 = local_90;
    lVar31 = lVar31 + -1;
    pTVar32 = pTVar32 + -1;
    if (lVar31 <= (long)local_a8) break;
LAB_0016c1c2:
    if (((pTVar32->flags & 0x200) == 0) &&
       (iVar11 = fitsInsideBoundaries(&dec->coord32,pTVar32), iVar11 != 0)) goto LAB_0016c559;
  }
  if ((int)uVar22 < (int)(uVar22 + iVar9)) {
    pTVar32 = (TerritoryBoundary *)(local_88 + 0x1c3470);
    iVar11 = 0;
    do {
      if (((pTVar32->flags & 0x200) == 0) &&
         (iVar8 = restrictZoneTo(&local_78,pMVar19,pTVar32), iVar8 != 0)) {
        if (iVar11 != 0) {
          iVar11 = iVar11 + 1;
          break;
        }
        local_d8 = (double)CONCAT44(local_78.fminy._4_4_,local_78.fminy._0_4_);
        dStack_d0 = local_78.fmaxy;
        local_a8 = local_78.fminx;
        dStack_a0 = local_78.fmaxx;
        iVar11 = 1;
      }
      pTVar32 = pTVar32 + 1;
      uVar14 = (int)uVar28 - 1;
      uVar28 = (ulong)uVar14;
    } while (uVar14 != 0);
    if (iVar11 != 0) {
      if (iVar11 == 1) {
        (dec->zone).fminy = local_d8;
        (dec->zone).fmaxy = dStack_d0;
        (dec->zone).fminx = local_a8;
        (dec->zone).fmaxx = dStack_a0;
      }
LAB_0016c559:
      pMVar19 = &dec->zone;
      restrictZoneTo(pMVar19,pMVar19,TERRITORY_BOUNDARIES + lVar23);
      dVar35 = (dec->zone).fminx;
      dVar38 = (dec->zone).fmaxx;
      if (dVar35 < dVar38) {
        dVar34 = (dec->zone).fmaxy;
        MVar7 = ERR_MAPCODE_UNDECODABLE;
        if (pMVar19->fminy < dVar34) {
          dVar34 = floor((dVar34 + pMVar19->fminy) * 0.5);
          dVar35 = floor((dVar38 + dVar35) * 0.5);
          auVar36._8_8_ = dVar35;
          auVar36._0_8_ = dVar34;
          PVar37 = (Point)divpd(auVar36,_DAT_001c3370);
          dec->result = PVar37;
          dVar35 = -90.0;
          if ((PVar37.lat < -90.0) || (dVar35 = 90.0, 90.0 < PVar37.lat)) {
            (dec->result).lat = dVar35;
          }
          dVar38 = PVar37.lon;
          dVar35 = (double)(~-(ulong)(dVar38 < -180.0) & (ulong)dVar38 |
                           (ulong)(dVar38 + 360.0) & -(ulong)(dVar38 < -180.0));
          if ((dVar38 < -180.0) || (180.0 <= dVar35)) {
            (dec->result).lon =
                 (double)(~-(ulong)(180.0 <= dVar35) & (ulong)dVar35 |
                         (ulong)(dVar35 + -360.0) & -(ulong)(180.0 <= dVar35));
          }
          if ((char)local_7c != '\0') {
            return ERR_OK;
          }
          repackIfAllDigits(__s,0);
          return ERR_OK;
        }
        goto LAB_0016c6db;
      }
    }
  }
LAB_0016c6d5:
  MVar7 = ERR_MAPCODE_UNDECODABLE;
LAB_0016c6db:
  (dec->result).lat = 0.0;
  (dec->result).lon = 0.0;
  return MVar7;
}

Assistant:

static enum MapcodeError decoderEngine(DecodeRec *dec, int parseFlags) {
    enum Territory ccode;
    enum MapcodeError err;
    int codex;
    int from;
    int upto;
    int i;
    char *s;
    int wasAllDigits = 0;
    ASSERT(dec);

    err = parseMapcodeString(&dec->mapcodeElements, dec->orginput, parseFlags, dec->context);
    if (err) { // clear all parsed fields in case of error
        dec->mapcodeElements.territoryISO[0] = 0;
        dec->mapcodeElements.properMapcode[0] = 0;
        dec->mapcodeElements.precisionExtension[0] = 0;
        return err;
    }

    ccode = dec->mapcodeElements.territoryCode;
    dec->context = ccode;
    dec->mapcode = dec->mapcodeElements.properMapcode;
    dec->extension = dec->mapcodeElements.precisionExtension;
    codex = dec->mapcodeElements.indexOfDot * 9 + (int) strlen(dec->mapcodeElements.properMapcode) - 1;
    s = dec->mapcodeElements.properMapcode;

    if (strchr(s, 'A') || strchr(s, 'E') || strchr(s, 'U')) {
        if (unpackIfAllDigits(s) <= 0) {
            return ERR_INVALID_VOWEL;
        }
        wasAllDigits = 1;
    }

    if (codex > 54) {
        ASSERT(codex == 55);
        return ERR_MAPCODE_UNDECODABLE;
    } else if (codex == 54) {
        // international mapcodes must be in international context
        ccode = TERRITORY_AAA;
    } else if (ccode < _TERRITORY_MIN) {
        return ERR_MISSING_TERRITORY;
    } else if (isSubdivision(ccode)) {
        // int mapcodes must be interpreted in the parent of a subdivision
        enum Territory parent = parentTerritoryOf(ccode);
        if ((codex == 44) || ((codex == 34 || codex == 43) && (parent == TERRITORY_IND || parent == TERRITORY_MEX))) {
            ccode = parent;
        }
    }

    from = firstRec(ccode);
    upto = lastRec(ccode);

    // try all ccode rectangles to decode s (pointing to first character of proper mapcode), assume not decodable
    err = ERR_MAPCODE_UNDECODABLE;
    for (i = from; i <= upto; i++) {
        const int codexi = coDex(i);
        const int r = REC_TYPE(i);
        if (r == 0) {
            if (IS_NAMELESS(i)) {
                if (((codexi == 21) && (codex == 22)) ||
                    ((codexi == 22) && (codex == 32)) ||
                    ((codexi == 13) && (codex == 23))) {
                    err = decodeNameless(dec, i);
                    break;
                }
            } else {
                if ((codexi == codex) || ((codex == 22) && (codexi == 21))) {
                    err = decodeGrid(dec, i, 0);

                    // first of all, make sure the zone fits the country
                    restrictZoneTo(&dec->zone, &dec->zone, TERRITORY_BOUNDARY(upto));

                    if ((err == ERR_OK) && IS_RESTRICTED(i)) {
                        int nrZoneOverlaps = 0;
                        int j;

                        // *** make sure decode fits somewhere ***
                        dec->result = getMidPointFractions(&dec->zone);
                        dec->coord32 = convertFractionsToCoord32(&dec->result);
                        for (j = i - 1; j >= from; j--) { // look in previous rects
                            if (!IS_RESTRICTED(j)) {
                                if (fitsInsideBoundaries(&dec->coord32, TERRITORY_BOUNDARY(j))) {
                                    nrZoneOverlaps = 1;
                                    break;
                                }
                            }
                        }

                        if (!nrZoneOverlaps) {
                            MapcodeZone zfound;
                            TerritoryBoundary prevu;
                            for (j = from; j < i; j++) { // try all smaller rectangles j
                                if (!IS_RESTRICTED(j)) {
                                    MapcodeZone z;
                                    if (restrictZoneTo(&z, &dec->zone, TERRITORY_BOUNDARY(j))) {
                                        nrZoneOverlaps++;
                                        if (nrZoneOverlaps == 1) {
                                            // first fit! remember...
                                            zoneCopyFrom(&zfound, &z);
                                            ASSERT(j <= MAPCODE_BOUNDARY_MAX);
                                            memcpy(&prevu, TERRITORY_BOUNDARY(j), sizeof(TerritoryBoundary));
                                        } else { // nrZoneOverlaps >= 2
                                            // more than one hit
                                            break; // give up
                                        }
                                    }
                                } // IS_RESTRICTED
                            } // for j

                            // if several sub-areas intersect, just return the whole zone
                            // (the center of which may NOT re-encode to the same mapcode!)
                            if (nrZoneOverlaps == 1) { // found exactly ONE intersection?
                                zoneCopyFrom(&dec->zone, &zfound);
                            }
                        }

                        if (!nrZoneOverlaps) {
                            err = ERR_MAPCODE_UNDECODABLE; // type 3 "NLD L222.222"
                        }
                    }  // *** make sure decode fits somewhere ***
                    break;
                }
            }
        } else if (r == 1) {
            if (codex == codexi + 10 && HEADER_LETTER(i) == *s) {
                err = decodeGrid(dec, i, 1);
                break;
            }
        } else { //r>1
            if (((codex == 23) && (codexi == 22)) ||
                ((codex == 33) && (codexi == 23))) {
                err = decodeAutoHeader(dec, i);
                break;
            }
        }
    } // for

    if (!err) {
        restrictZoneTo(&dec->zone, &dec->zone, TERRITORY_BOUNDARY(lastRec(ccode)));

        if (isEmpty(&dec->zone)) {
            err = ERR_MAPCODE_UNDECODABLE; // type 0 "BRA xx.xx"
        }
    }

    if (err) {
        dec->result.lat = dec->result.lon = 0;
        return err;
    }

    dec->result = getMidPointFractions(&dec->zone);
    dec->result = convertFractionsToDegrees(&dec->result);

    // normalise between =180 and 180
    if (dec->result.lat < -90.0) {
        dec->result.lat = -90.0;
    }
    if (dec->result.lat > 90.0) {
        dec->result.lat = 90.0;
    }
    if (dec->result.lon < -180.0) {
        dec->result.lon += 360.0;
    }
    if (dec->result.lon >= 180.0) {
        dec->result.lon -= 360.0;
    }

    if (wasAllDigits) {
        repackIfAllDigits(dec->mapcodeElements.properMapcode, 0);
    }
    return ERR_OK;
}